

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pTVar1;
  GCObject *pGVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (n == 0) {
    iVar3 = 0x16;
  }
  else {
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    pGVar2 = (GCObject *)luaF_newCclosure(L,n);
    (pGVar2->h).node = (Node *)fn;
    lVar4 = (long)n;
    L->top = L->top + -lVar4;
    lVar5 = lVar4 * 0x10 + 0x10;
    do {
      pTVar1 = L->top;
      *(undefined8 *)((long)pGVar2 + lVar5) = *(undefined8 *)((long)&pTVar1[-2].value_ + lVar5);
      *(undefined4 *)((long)pGVar2 + lVar5 + 8) = *(undefined4 *)(lVar5 + -0x18 + (long)pTVar1);
      lVar5 = lVar5 + -0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    iVar3 = 0x66;
    fn = (lua_CFunction)pGVar2;
  }
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)fn;
  pTVar1->tt_ = iVar3;
  L->top = L->top + 1;
  return;
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(L->top, fn);
  }
  else {
    Closure *cl;
    api_checknelems(L, n);
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    luaC_checkGC(L);
    cl = luaF_newCclosure(L, n);
    cl->c.f = fn;
    L->top -= n;
    while (n--)
      setobj2n(L, &cl->c.upvalue[n], L->top + n);
    setclCvalue(L, L->top, cl);
  }
  api_incr_top(L);
  lua_unlock(L);
}